

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lpkMap.c
# Opt level: O1

If_Obj_t * Lpk_MapPrime(Lpk_Man_t *p,uint *pTruth,int nVars,If_Obj_t **ppLeaves)

{
  Kit_Graph_t *pGraph;
  long lVar1;
  If_Obj_t *pIVar2;
  long lVar3;
  
  pGraph = Kit_TruthToGraph(pTruth,nVars,p->vCover);
  if (pGraph == (Kit_Graph_t *)0x0) {
    pIVar2 = (If_Obj_t *)0x0;
  }
  else {
    if (0 < pGraph->nLeaves) {
      lVar1 = 1;
      lVar3 = 0;
      do {
        *(If_Obj_t **)(&pGraph->pNodes->eEdge0 + lVar1 * 2) = ppLeaves[lVar3];
        lVar3 = lVar3 + 1;
        lVar1 = lVar1 + 3;
      } while (lVar3 < pGraph->nLeaves);
    }
    pIVar2 = Lpk_MapPrimeInternal(p->pIfMan,pGraph);
    pIVar2 = (If_Obj_t *)((ulong)((uint)pGraph->eRoot & 1) ^ (ulong)pIVar2);
    Kit_GraphFree(pGraph);
  }
  return pIVar2;
}

Assistant:

If_Obj_t * Lpk_MapPrime( Lpk_Man_t * p, unsigned * pTruth, int nVars, If_Obj_t ** ppLeaves )
{
    Kit_Graph_t * pGraph;
    Kit_Node_t * pNode;
    If_Obj_t * pRes;
    int i;
    // derive the factored form
    pGraph = Kit_TruthToGraph( pTruth, nVars, p->vCover );
    if ( pGraph == NULL )
        return NULL;
    // collect the fanins
    Kit_GraphForEachLeaf( pGraph, pNode, i )
        pNode->pFunc = ppLeaves[i];
    // perform strashing
    pRes = Lpk_MapPrimeInternal( p->pIfMan, pGraph );
    pRes = If_NotCond( pRes, Kit_GraphIsComplement(pGraph) );
    Kit_GraphFree( pGraph );
    return pRes;
}